

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_cache_lcp_2way<true,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  _Alloc_hider _Var1;
  ushort b;
  ushort a;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ushort *puVar5;
  uchar **__dest;
  uchar **local_e8;
  uchar **local_e0;
  lcp_t *local_d8;
  pointer local_d0;
  size_t local_c8;
  uint16_t *local_c0;
  pointer local_b8;
  lcp_t *local_a0;
  ulong *local_98;
  uint16_t *local_90;
  size_t local_80;
  string local_70;
  string local_50;
  
  local_98 = lcp_result;
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"merge_cache_lcp_2way");
  poVar4 = std::operator<<(poVar4,"(): n0=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", n1=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,'\n');
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  local_80 = n1;
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  local_c0 = cache_input0 + 1;
  a = *cache_input0;
  local_90 = cache_input1 + 1;
  b = *cache_input1;
  local_e0 = from1;
  local_a0 = lcp_input1;
  if (a < b) {
    iVar2 = cmp(*from0,*from1);
    if (-1 < iVar2) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    uVar3 = lcp(a,b);
    if (uVar3 != 0) {
      b = get_char<unsigned_short>(*from1,1);
    }
    *result = *from0;
    *cache_result = a;
    local_d0 = (pointer)(ulong)uVar3;
    local_c8 = n0 - 1;
    if (local_c8 == 0) {
LAB_0021b2b8:
      __dest = result + 1;
      puVar5 = cache_result + 1;
      goto LAB_0021b2c6;
    }
    local_e8 = from0 + 1;
    local_b8 = (pointer)*lcp_input0;
    local_d8 = lcp_input0 + 1;
    a = cache_input0[1];
    local_c0 = cache_input0 + 2;
LAB_0021b4bd:
    __dest = result + 1;
    puVar5 = cache_result + 1;
    do {
      while( true ) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"Starting loop, n0=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", n1=");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," ...\n");
        poVar4 = std::operator<<(poVar4,"\tprev   = \'");
        poVar4 = std::operator<<(poVar4,(char *)__dest[-1]);
        poVar4 = std::operator<<(poVar4,"\'\n");
        poVar4 = std::operator<<(poVar4,"\t*from0 = \'");
        poVar4 = std::operator<<(poVar4,(char *)*local_e8);
        poVar4 = std::operator<<(poVar4,"\'\n");
        poVar4 = std::operator<<(poVar4,"\t*from1 = \'");
        poVar4 = std::operator<<(poVar4,(char *)*local_e0);
        poVar4 = std::operator<<(poVar4,"\'\n");
        poVar4 = std::operator<<(poVar4,"\tlcp0   = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\tlcp1   = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\tcache0 = \'");
        to_str_abi_cxx11_(&local_70,a);
        poVar4 = std::operator<<(poVar4,(string *)&local_70);
        poVar4 = std::operator<<(poVar4,"\'\n");
        poVar4 = std::operator<<(poVar4,"\tcache1 = \'");
        to_str_abi_cxx11_(&local_50,b);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,"\'\n");
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        check_lcp_and_cache<unsigned_short>
                  (__dest[-1],*local_e8,(lcp_t)local_b8,a,*local_e0,(lcp_t)local_d0,b);
        if (local_b8 <= local_d0) break;
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar4,"\tlcp0 > lcp1\n");
        iVar2 = cmp(*local_e8,*local_e0);
        if (-1 < iVar2) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                       );
        }
        *__dest = *local_e8;
        *local_98 = (ulong)local_b8;
        *puVar5 = a;
        local_b8 = (pointer)*local_d8;
        a = *local_c0;
LAB_0021b7a6:
        local_c0 = local_c0 + 1;
        local_d8 = local_d8 + 1;
        local_e8 = local_e8 + 1;
        lcp_result = local_98 + 1;
        __dest = __dest + 1;
        puVar5 = puVar5 + 1;
        local_c8 = local_c8 - 1;
        local_98 = lcp_result;
        if (local_c8 == 0) goto LAB_0021b2c6;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      if (local_d0 <= local_b8) {
        std::operator<<(poVar4,"\tlcp0 == lcp1\n");
        if (a < b) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
          std::operator<<(poVar4,"\t\tcache0 < cache1\n");
          iVar2 = cmp(*local_e8,*local_e0);
          if (-1 < iVar2) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                         );
          }
          uVar3 = lcp(a,b);
          if (uVar3 != 0) {
            local_d0 = local_d0 + 1;
            b = get_char<unsigned_short>(*local_e0,(size_t)local_d0);
          }
          *__dest = *local_e8;
          *local_98 = (ulong)local_b8;
          *puVar5 = a;
          local_b8 = (pointer)*local_d8;
          a = *local_c0;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
          if (b < a) {
            std::operator<<(poVar4,"\t\tcache0 > cache1\n");
            iVar2 = cmp(*local_e8,*local_e0);
            if (iVar2 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                           );
            }
            uVar3 = lcp(a,b);
            if (uVar3 != 0) {
              local_b8 = local_b8 + 1;
              a = get_char<unsigned_short>(*local_e8,(size_t)local_b8);
            }
            *__dest = *local_e0;
            *local_98 = (ulong)local_d0;
            *puVar5 = b;
            local_d0 = (pointer)*local_a0;
            b = *local_90;
            goto joined_r0x0021b882;
          }
          std::operator<<(poVar4,"\t\tcache0 == cache1\n");
          if ((char)a == '\0') {
            iVar2 = cmp(*local_e8,*local_e0);
            if (iVar2 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                           );
            }
            *__dest = *local_e8;
            *local_98 = (ulong)local_b8;
            *puVar5 = a;
            local_b8 = (pointer)*local_d8;
            uVar3 = lcp(a,b);
            local_d0 = local_d0 + uVar3;
            a = *local_c0;
            b = 0;
          }
          else {
            compare((uchar *)&local_70,*local_e8,(size_t)*local_e0);
            _Var1._M_p = local_70._M_dataplus._M_p;
            local_d0 = local_70._M_dataplus._M_p;
            if ((int)local_70._M_string_length < 0) {
              *__dest = *local_e8;
              *local_98 = (ulong)local_b8;
              *puVar5 = a;
              local_b8 = (pointer)*local_d8;
              a = *local_c0;
              b = get_char<unsigned_short>(*local_e0,(size_t)local_70._M_dataplus._M_p);
            }
            else {
              if ((int)local_70._M_string_length != 0) {
                *__dest = *local_e0;
                *local_98 = (ulong)local_b8;
                *puVar5 = a;
                local_d0 = (pointer)*local_a0;
                a = get_char<unsigned_short>(*local_e8,(size_t)local_70._M_dataplus._M_p);
                b = *local_90;
                local_b8 = _Var1._M_p;
                goto joined_r0x0021b882;
              }
              *__dest = *local_e8;
              *local_98 = (ulong)local_b8;
              *puVar5 = a;
              local_b8 = (pointer)*local_d8;
              a = *local_c0;
              b = 0;
            }
          }
        }
        goto LAB_0021b7a6;
      }
      std::operator<<(poVar4,"\tlcp0 < lcp1\n");
      iVar2 = cmp(*local_e8,*local_e0);
      if (iVar2 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      *__dest = *local_e0;
      *local_98 = (ulong)local_d0;
      *puVar5 = b;
      local_d0 = (pointer)*local_a0;
      b = *local_90;
joined_r0x0021b882:
      local_80 = local_80 - 1;
      local_90 = local_90 + 1;
      local_a0 = local_a0 + 1;
      puVar5 = puVar5 + 1;
      lcp_result = local_98 + 1;
      __dest = __dest + 1;
      local_e0 = local_e0 + 1;
      from0 = local_e8;
      n0 = local_c8;
      local_98 = lcp_result;
    } while (local_80 != 0);
  }
  else {
    local_e8 = from0;
    local_d8 = lcp_input0;
    local_c8 = n0;
    if (a <= b) {
      if ((char)a != '\0') {
        compare((uchar *)&local_70,*from0,(size_t)*from1);
        local_b8 = local_70._M_dataplus._M_p;
        local_d0 = local_70._M_dataplus._M_p;
        if ((int)local_70._M_string_length < 0) {
          *result = *from0;
          __dest = result + 1;
          *cache_result = a;
          puVar5 = cache_result + 1;
          local_b8 = (pointer)*lcp_input0;
          a = cache_input0[1];
          b = get_char<unsigned_short>(*from1,(size_t)local_70._M_dataplus._M_p);
          local_c8 = n0 - 1;
          if (local_c8 != 0) {
            local_e8 = from0 + 1;
            local_d8 = lcp_input0 + 1;
            local_c0 = cache_input0 + 2;
            goto LAB_0021b4bd;
          }
        }
        else {
          __dest = result + 1;
          puVar5 = cache_result + 1;
          if ((int)local_70._M_string_length != 0) {
            *result = *from1;
            *cache_result = b;
            local_d0 = (pointer)*lcp_input1;
            a = get_char<unsigned_short>(*from0,(size_t)local_70._M_dataplus._M_p);
            local_80 = n1 - 1;
            if (local_80 == 0) goto LAB_0021b340;
            local_e0 = from1 + 1;
            local_a0 = lcp_input1 + 1;
            b = cache_input1[1];
            local_90 = cache_input1 + 2;
            goto LAB_0021b4bd;
          }
          *result = *from0;
          *cache_result = a;
          b = 0;
          if (n0 != 1) {
            local_b8 = (pointer)*lcp_input0;
            a = cache_input0[1];
            goto LAB_0021b4b8;
          }
        }
LAB_0021b2c6:
        if (local_80 == 0) {
          __assert_fail("n1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x51e,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                       );
        }
        *lcp_result = (lcp_t)local_d0;
        *puVar5 = b;
        memmove(__dest,local_e0,local_80 * 8);
        memmove(lcp_result + 1,local_a0,local_80 * 8);
        goto LAB_0021b389;
      }
      iVar2 = cmp(*from0,*from1);
      if (iVar2 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                     );
      }
      uVar3 = lcp(a,b);
      *result = *from0;
      *cache_result = a;
      local_d0 = (pointer)(ulong)uVar3;
      b = 0;
      if (n0 == 1) goto LAB_0021b2b8;
      local_b8 = (pointer)*lcp_input0;
      a = cache_input0[1];
LAB_0021b4b8:
      local_c8 = n0 - 1;
      local_d8 = lcp_input0 + 1;
      local_e8 = from0 + 1;
      b = 0;
      local_c0 = cache_input0 + 2;
      goto LAB_0021b4bd;
    }
    iVar2 = cmp(*from0,*from1);
    if (iVar2 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                   );
    }
    uVar3 = lcp(a,b);
    if (uVar3 != 0) {
      a = get_char<unsigned_short>(*from0,1);
    }
    *result = *from1;
    __dest = result + 1;
    *cache_result = b;
    puVar5 = cache_result + 1;
    local_b8 = (pointer)(ulong)uVar3;
    local_80 = n1 - 1;
    if (local_80 != 0) {
      local_e0 = from1 + 1;
      local_d0 = (pointer)*lcp_input1;
      local_a0 = lcp_input1 + 1;
      b = cache_input1[1];
      local_90 = cache_input1 + 2;
      goto LAB_0021b4bd;
    }
  }
LAB_0021b340:
  if (n0 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
  *lcp_result = (lcp_t)local_b8;
  *puVar5 = a;
  memmove(__dest,from0,n0 * 8);
  memmove(lcp_result + 1,local_d8,n0 * 8);
  local_90 = local_c0;
  local_80 = n0;
LAB_0021b389:
  memmove(puVar5 + 1,local_90,local_80 * 2);
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,'~');
  poVar4 = std::operator<<(poVar4,"merge_cache_lcp_2way");
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}